

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_split(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  char *__s2;
  bool bVar2;
  long *plVar3;
  Context *pCVar4;
  int32_t iVar5;
  int iVar6;
  anon_union_8_3_2f476f46_for_data aVar7;
  _func_int **pp_Var8;
  undefined4 extraout_var;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t __n;
  String delim;
  String self;
  anon_union_8_3_2f476f46_for_data local_f0;
  long *local_e8;
  undefined1 local_e0 [8];
  anon_union_8_3_2f476f46_for_data local_d8;
  anon_union_8_3_2f476f46_for_data local_d0;
  anon_union_8_3_2f476f46_for_data local_c8;
  anon_union_8_3_2f476f46_for_data local_c0;
  anon_union_8_3_2f476f46_for_data local_b8;
  anon_union_8_3_2f476f46_for_data local_b0;
  anon_union_8_3_2f476f46_for_data local_a8;
  bool local_a0;
  anon_union_8_3_2f476f46_for_data local_98;
  bool local_90;
  anon_union_8_3_2f476f46_for_data local_88;
  ValueType local_80;
  anon_union_8_3_2f476f46_for_data local_78;
  ValueType local_70;
  anon_union_8_3_2f476f46_for_data local_68;
  ListStorage<MiniScript::Context_*> *local_60;
  Context *local_58;
  double local_50;
  Value local_48;
  _func_int **local_38;
  
  local_80 = Null;
  aVar7.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar7.ref)->refCount = 1;
  (aVar7.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
  aVar7.ref[1].refCount = 5;
  aVar7.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var8 = (_func_int **)operator_new__(5);
  aVar7.ref[1]._vptr_RefCountedStorage = pp_Var8;
  *(undefined1 *)((long)pp_Var8 + 4) = 0;
  *(undefined4 *)pp_Var8 = 0x666c6573;
  local_88.ref = aVar7.ref;
  Context::GetVar((Context *)local_e0,(String *)partialResult.rs,(LocalOnlyMode)&local_88);
  Value::ToString((Value *)&local_78,(Machine *)local_e0);
  if ((Temp < local_e0[0]) && (local_d8.ref != (RefCountedStorage *)0x0)) {
    plVar3 = &(local_d8.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_d8.ref)->_vptr_RefCountedStorage[1])();
    }
    local_d8.number = 0.0;
  }
  if ((local_88.ref != (RefCountedStorage *)0x0) && (local_80 == Null)) {
    plVar3 = &(local_88.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_88.ref)->_vptr_RefCountedStorage[1])();
    }
    local_88.number = 0.0;
  }
  local_90 = false;
  aVar7.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar7.ref)->refCount = 1;
  ((RefCountedStorage *)&(aVar7.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  aVar7.ref[1].refCount = 10;
  aVar7.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var8 = (_func_int **)operator_new__(10);
  aVar7.ref[1]._vptr_RefCountedStorage = pp_Var8;
  *pp_Var8 = (_func_int *)0x6574696d696c6564;
  *(undefined2 *)(pp_Var8 + 1) = 0x72;
  local_98.ref = aVar7.ref;
  Context::GetVar((Context *)&local_f0,(String *)partialResult.rs,(LocalOnlyMode)&local_98);
  Value::ToString((Value *)local_e0,(Machine *)&local_f0);
  if ((2 < (byte)local_f0.tempNum._0_1_) && (local_e8 != (long *)0x0)) {
    plVar3 = local_e8 + 1;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (**(code **)(*local_e8 + 8))();
    }
    local_e8 = (long *)0x0;
  }
  if (((ListStorage<MiniScript::Value> *)local_98.ref != (ListStorage<MiniScript::Value> *)0x0) &&
     (local_90 == false)) {
    plVar3 = &(local_98.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*((RefCountedStorage *)&(local_98.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
                ();
    }
    local_98.number = 0.0;
  }
  local_a0 = false;
  aVar7.ref = (RefCountedStorage *)operator_new(0x30);
  (aVar7.ref)->refCount = 1;
  ((RefCountedStorage *)&(aVar7.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  aVar7.ref[1].refCount = 9;
  aVar7.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
  pp_Var8 = (_func_int **)operator_new__(9);
  aVar7.ref[1]._vptr_RefCountedStorage = pp_Var8;
  *pp_Var8 = (_func_int *)0x746e756f4378616d;
  *(undefined1 *)(pp_Var8 + 1) = 0;
  local_a8.ref = aVar7.ref;
  Context::GetVar((Context *)&local_68,(String *)partialResult.rs,(LocalOnlyMode)&local_a8);
  iVar5 = Value::IntValue((Value *)&local_68);
  local_50 = (double)CONCAT44(extraout_var,iVar5);
  if ((2 < (byte)local_68.tempNum._0_1_) && (local_60 != (ListStorage<MiniScript::Context_*> *)0x0))
  {
    plVar3 = &(local_60->super_RefCountedStorage).refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*(local_60->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_60 = (ListStorage<MiniScript::Context_*> *)0x0;
  }
  if (((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_a8.ref !=
       (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) && (local_a0 == false)) {
    plVar3 = &(local_a8.ref)->refCount;
    *plVar3 = *plVar3 + -1;
    if (*plVar3 == 0) {
      (*((RefCountedStorage *)&(local_a8.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
                ();
    }
    local_a8.number = 0.0;
  }
  local_f0.number = 0.0;
  local_e8 = (long *)((ulong)local_e8 & 0xffffffffffffff00);
  local_38 = (_func_int **)(long)(SUB84(local_50,0) + -1);
  uVar16 = 0;
  local_58 = context;
  do {
    aVar7 = local_78;
    if (local_78.ref == (RefCountedStorage *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = local_78.ref[1].refCount - 1;
    }
    if (uVar9 <= uVar16) {
      local_48.type = List;
      local_48.noInvoke = false;
      local_48.localOnly = Off;
      if (local_f0.ref == (RefCountedStorage *)0x0) {
        local_f0.ref = (RefCountedStorage *)operator_new(0x30);
        (local_f0.ref)->refCount = 1;
        local_f0.ref[1]._vptr_RefCountedStorage = (_func_int **)0x0;
        local_f0.ref[1].refCount = 0;
        local_f0.ref[2]._vptr_RefCountedStorage = (_func_int **)0x0;
        local_f0.ref[2].refCount = 0;
        (local_f0.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__ListStorage_001bf138;
        lVar11 = 2;
      }
      else {
        lVar11 = (local_f0.ref)->refCount + 1;
      }
      pCVar4 = local_58;
      (local_f0.ref)->refCount = lVar11;
      ((RefCountedStorage *)&local_58->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      local_48.data = local_f0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)local_58);
      Value::operator=((Value *)(((RefCountedStorage *)&pCVar4->code)->_vptr_RefCountedStorage + 3),
                       &local_48);
      *(undefined1 *)(((RefCountedStorage *)&pCVar4->code)->_vptr_RefCountedStorage + 2) = 1;
      if ((Temp < local_48.type) && (local_48.data.ref != (RefCountedStorage *)0x0)) {
        plVar3 = &(local_48.data.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_48.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_48.data.number = 0.0;
      }
      if ((local_f0.ref != (RefCountedStorage *)0x0) && ((char)local_e8 == '\0')) {
        plVar3 = &(local_f0.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_f0.ref)->_vptr_RefCountedStorage[1])();
        }
      }
      plVar3 = (long *)CONCAT71(local_e0._1_7_,local_e0[0]);
      if ((plVar3 != (long *)0x0) && ((bool)local_d8.tempNum._0_1_ == false)) {
        plVar1 = plVar3 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar3 + 8))();
        }
      }
      if ((local_78.ref != (RefCountedStorage *)0x0) && (local_70 == Null)) {
        plVar3 = &(local_78.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_78.ref)->_vptr_RefCountedStorage[1])();
        }
      }
      return (IntrinsicResult)(IntrinsicResultStorage *)pCVar4;
    }
    if (local_50._0_4_ < 0) {
LAB_0014fc97:
      lVar11 = CONCAT71(local_e0._1_7_,local_e0[0]);
      if ((lVar11 == 0) || (uVar9 = *(ulong *)(lVar11 + 0x18), uVar9 < 2)) {
        uVar14 = uVar16 + 1;
LAB_0014fcaf:
        if ((long)uVar14 < 0) goto LAB_0014fd13;
        if (aVar7.ref != (RefCountedStorage *)0x0) {
          uVar10 = aVar7.ref[1].refCount;
          goto LAB_0014fd20;
        }
      }
      else {
        if (local_78.ref == (RefCountedStorage *)0x0) goto LAB_0014fd5e;
        uVar10 = local_78.ref[1].refCount;
        if ((long)(uVar10 - uVar9) < (long)uVar16) goto LAB_0014fd1c;
        local_d0 = (anon_union_8_3_2f476f46_for_data)
                   ((anon_union_8_3_2f476f46_for_data *)(local_78.ref + 1))->ref;
        __s2 = *(char **)(lVar11 + 0x10);
        uVar14 = uVar16;
        do {
          iVar6 = strncmp((char *)((long)&(local_d0.ref)->_vptr_RefCountedStorage + uVar14),__s2,
                          uVar9 - 1);
          if (iVar6 == 0) goto LAB_0014fcaf;
          bVar2 = (long)uVar14 < (long)(uVar10 - uVar9);
          uVar14 = uVar14 + 1;
        } while (bVar2);
LAB_0014fd13:
        if (aVar7.ref != (RefCountedStorage *)0x0) {
          uVar10 = aVar7.ref[1].refCount;
LAB_0014fd1c:
          uVar14 = uVar10 - 1;
          goto LAB_0014fd20;
        }
LAB_0014fd5e:
        uVar14 = 0;
      }
LAB_0014fd61:
      aVar7.number = 0.0;
    }
    else {
      if (local_f0.ref == (RefCountedStorage *)0x0) {
        pp_Var8 = (_func_int **)0x0;
      }
      else {
        pp_Var8 = local_f0.ref[2]._vptr_RefCountedStorage;
      }
      if (pp_Var8 != local_38) goto LAB_0014fc97;
      if (local_78.ref == (RefCountedStorage *)0x0) goto LAB_0014fd5e;
      uVar10 = local_78.ref[1].refCount;
      uVar14 = uVar10 - 1;
      if ((long)uVar14 < 0) goto LAB_0014fd1c;
LAB_0014fd20:
      if (uVar10 <= uVar16) goto LAB_0014fd61;
      sVar12 = uVar14 - uVar16;
      sVar13 = ~uVar16 + uVar10;
      __n = sVar12;
      if ((long)sVar13 < (long)sVar12) {
        __n = sVar13;
      }
      if (sVar12 == 0xffffffffffffffff) {
        __n = sVar13;
      }
      if ((uVar16 == 0) && (__n == uVar10)) {
        (aVar7.ref)->refCount = (aVar7.ref)->refCount + 1;
      }
      else {
        local_d0.ref = (RefCountedStorage *)operator_new(0x30);
        uVar9 = __n + 1;
        (local_d0.ref)->refCount = 1;
        (local_d0.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
        local_d0.ref[1].refCount = uVar9;
        local_d0.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        pp_Var8 = (_func_int **)operator_new__(uVar9);
        local_d0.ref[1]._vptr_RefCountedStorage = pp_Var8;
        memset(pp_Var8,0,uVar9);
        memcpy(pp_Var8,(void *)(uVar16 + (long)aVar7.ref[1]._vptr_RefCountedStorage),__n);
        aVar7 = local_d0;
      }
    }
    local_b8.tempNum._0_2_ = 3;
    local_b8.tempNum._2_1_ = 0;
    local_b0 = aVar7;
    if (aVar7.ref == (RefCountedStorage *)0x0) {
      local_b0 = DAT_001c1308;
    }
    if (local_b0.ref != (RefCountedStorage *)0x0) {
      (local_b0.ref)->refCount = (local_b0.ref)->refCount + 1;
    }
    List<MiniScript::Value>::Add((List<MiniScript::Value> *)&local_f0,(Value *)&local_b8);
    if ((2 < (byte)local_b8.tempNum._0_1_) && (local_b0.ref != (RefCountedStorage *)0x0)) {
      plVar3 = &(local_b0.ref)->refCount;
      *plVar3 = *plVar3 + -1;
      if (*plVar3 == 0) {
        (*(local_b0.ref)->_vptr_RefCountedStorage[1])();
      }
      local_b0.number = 0.0;
    }
    if (aVar7.ref != (RefCountedStorage *)0x0) {
      plVar3 = &(aVar7.ref)->refCount;
      *plVar3 = *plVar3 + -1;
      if (*plVar3 == 0) {
        (*(aVar7.ref)->_vptr_RefCountedStorage[1])(aVar7.number);
      }
    }
    lVar11 = CONCAT71(local_e0._1_7_,local_e0[0]);
    if (lVar11 == 0) {
      lVar15 = 0;
    }
    else {
      lVar15 = *(long *)(lVar11 + 0x18) + -1;
    }
    if (local_78.ref == (RefCountedStorage *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = local_78.ref[1].refCount - 1;
    }
    uVar16 = lVar15 + uVar14;
    if (((lVar11 != 0) && (uVar16 == uVar9)) && (1 < *(ulong *)(lVar11 + 0x18))) {
      local_c8.tempNum._0_1_ = Value::emptyString;
      local_c8.tempNum._1_2_ = _DAT_001c1301;
      local_c0 = DAT_001c1308;
      if (DAT_001c1308.ref != (RefCountedStorage *)0x0 && 2 < Value::emptyString) {
        (DAT_001c1308.ref)->refCount = (DAT_001c1308.ref)->refCount + 1;
      }
      List<MiniScript::Value>::Add((List<MiniScript::Value> *)&local_f0,(Value *)&local_c8);
      if ((2 < (byte)local_c8.tempNum._0_1_) && (local_c0.ref != (RefCountedStorage *)0x0)) {
        plVar3 = &(local_c0.ref)->refCount;
        *plVar3 = *plVar3 + -1;
        if (*plVar3 == 0) {
          (*(local_c0.ref)->_vptr_RefCountedStorage[1])();
        }
        local_c0.number = 0.0;
      }
    }
  } while( true );
}

Assistant:

static IntrinsicResult intrinsic_split(Context *context, IntrinsicResult partialResult) {
		String self = context->GetVar("self").ToString();
		String delim = context->GetVar("delimiter").ToString();
		long maxCount = context->GetVar("maxCount").IntValue();
		ValueList result;
		long posB = 0;
		while (posB < self.LengthB()) {
			long nextPos;
			if (maxCount >= 0 and result.Count() == maxCount - 1) nextPos = self.LengthB();
			else if (delim.empty()) nextPos = posB + 1;
			else nextPos = self.IndexOfB(delim, posB);
			if (nextPos < 0) nextPos = self.LengthB();
			result.Add(self.SubstringB(posB, nextPos - posB));
			posB = nextPos + delim.LengthB();
			if (posB == self.LengthB() && !delim.empty()) result.Add(Value::emptyString);
		}
		return IntrinsicResult(result);
	}